

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

void __thiscall
FSliderItem::FSliderItem
          (FSliderItem *this,int x,int y,int height,char *text,FFont *font,EColorRange color,
          FName *action,int min,int max,int step)

{
  FName local_34;
  FFont *local_30;
  FFont *font_local;
  char *text_local;
  int local_18;
  int height_local;
  int y_local;
  int x_local;
  FSliderItem *this_local;
  
  local_30 = font;
  font_local = (FFont *)text;
  text_local._4_4_ = height;
  local_18 = y;
  height_local = x;
  _y_local = this;
  FName::FName(&local_34,action);
  FListMenuItemSelectable::FListMenuItemSelectable
            (&this->super_FListMenuItemSelectable,x,y,height,&local_34,-1);
  (this->super_FListMenuItemSelectable).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FSliderItem_009eee90;
  FString::FString(&this->mText);
  FString::operator=(&this->mText,(char *)font_local);
  this->mFont = local_30;
  this->mFontColor = color;
  this->mSelection = 0;
  this->mMinrange = min;
  this->mMaxrange = max;
  this->mStep = step;
  return;
}

Assistant:

FSliderItem::FSliderItem(int x, int y, int height, const char *text, FFont *font, EColorRange color, FName action, int min, int max, int step)
: FListMenuItemSelectable(x, y, height, action)
{
	mText = text;
	mFont = font;
	mFontColor = color;
	mSelection = 0;
	mMinrange = min;
	mMaxrange = max;
	mStep = step;
}